

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setSignificantDigitsUsed(DecimalFormat *this,UBool useSignificantDigits)

{
  DecimalFormatProperties *pDVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (useSignificantDigits == '\0') {
    iVar2 = -1;
    iVar3 = iVar2;
    if ((pDVar1->minimumSignificantDigits == -1) && (pDVar1->maximumSignificantDigits == -1)) {
      return;
    }
  }
  else {
    if ((pDVar1->minimumSignificantDigits != -1) || (pDVar1->maximumSignificantDigits != -1)) {
      return;
    }
    iVar2 = 1;
    iVar3 = 6;
  }
  pDVar1->minimumSignificantDigits = iVar2;
  pDVar1->maximumSignificantDigits = iVar3;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setSignificantDigitsUsed(UBool useSignificantDigits) {
    // These are the default values from the old implementation.
    if (useSignificantDigits) {
        if (fields->properties->minimumSignificantDigits != -1 ||
            fields->properties->maximumSignificantDigits != -1) {
            return;
        }
    } else {
        if (fields->properties->minimumSignificantDigits == -1 &&
            fields->properties->maximumSignificantDigits == -1) {
            return;
        }
    }
    int32_t minSig = useSignificantDigits ? 1 : -1;
    int32_t maxSig = useSignificantDigits ? 6 : -1;
    fields->properties->minimumSignificantDigits = minSig;
    fields->properties->maximumSignificantDigits = maxSig;
    touchNoError();
}